

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadContributorInfo(ColladaParser *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator<char> local_31;
  string local_30;
  ColladaParser *local_10;
  ColladaParser *this_local;
  
  local_10 = this;
  uVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar1 & 1) == 0) {
    do {
      while( true ) {
        uVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar1 & 1) == 0) {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        ReadMetaDataItem(this,&this->mAssetMetaData);
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"contributor");
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Expected end of <contributor> element.",&local_31);
      ThrowException(this,&local_30);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadContributorInfo()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            ReadMetaDataItem(mAssetMetaData);
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "contributor") != 0)
                ThrowException("Expected end of <contributor> element.");
            break;
        }
    }
}